

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void __thiscall lest::count::~count(count *this)

{
  ostream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  text local_60;
  text local_40;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," selected ",10);
  local_80 = &local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"test","");
  if (local_80 == &local_70) {
    local_60.field_2._8_8_ = local_70._8_8_;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
  local_60.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  pluralise(&local_40,&local_60,this->n);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

~count()
    {
        os << n << " selected " << pluralise("test", n) << "\n";
    }